

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<long_long,fmt::v5::basic_format_specs<wchar_t>>::hex_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<long_long,fmt::v5::basic_format_specs<wchar_t>>::hex_writer>
             *this,wchar_t **it)

{
  wchar_t wVar1;
  uint uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  wchar_t *pwVar7;
  wchar_t *pwVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  int iVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar16 [16];
  
  lVar9 = *(long *)(this + 8);
  if (lVar9 != 0) {
    pwVar7 = *it;
    if (0 < lVar9) {
      pcVar10 = *(char **)this;
      lVar9 = lVar9 + 1;
      do {
        *pwVar7 = (int)*pcVar10;
        pcVar10 = pcVar10 + 1;
        pwVar7 = pwVar7 + 1;
        lVar9 = lVar9 + -1;
      } while (1 < lVar9);
    }
    *it = pwVar7;
  }
  auVar6 = _DAT_00137fc0;
  auVar5 = _DAT_00137fb0;
  auVar4 = _DAT_00137010;
  pwVar8 = *it;
  lVar9 = *(long *)(this + 0x18);
  pwVar7 = pwVar8;
  if (lVar9 != 0) {
    pwVar7 = pwVar8 + lVar9;
    wVar1 = *(wchar_t *)(this + 0x10);
    uVar11 = lVar9 + 0x3fffffffffffffffU & 0x3fffffffffffffff;
    auVar13._8_4_ = (int)uVar11;
    auVar13._0_8_ = uVar11;
    auVar13._12_4_ = (int)(uVar11 >> 0x20);
    lVar12 = 0;
    auVar13 = auVar13 ^ _DAT_00137010;
    do {
      auVar15._8_4_ = (int)lVar12;
      auVar15._0_8_ = lVar12;
      auVar15._12_4_ = (int)((ulong)lVar12 >> 0x20);
      auVar16 = (auVar15 | auVar6) ^ auVar4;
      iVar14 = auVar13._4_4_;
      if ((bool)(~(auVar16._4_4_ == iVar14 && auVar13._0_4_ < auVar16._0_4_ ||
                  iVar14 < auVar16._4_4_) & 1)) {
        pwVar8[lVar12] = wVar1;
      }
      if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
          auVar16._12_4_ <= auVar13._12_4_) {
        pwVar8[lVar12 + 1] = wVar1;
      }
      auVar15 = (auVar15 | auVar5) ^ auVar4;
      iVar17 = auVar15._4_4_;
      if (iVar17 <= iVar14 && (iVar17 != iVar14 || auVar15._0_4_ <= auVar13._0_4_)) {
        pwVar8[lVar12 + 2] = wVar1;
        pwVar8[lVar12 + 3] = wVar1;
      }
      lVar12 = lVar12 + 4;
    } while ((uVar11 - ((uint)(lVar9 + 0x3fffffffffffffffU) & 3)) + 4 != lVar12);
  }
  *it = pwVar7;
  uVar2 = *(uint *)(this + 0x28);
  pcVar10 = "0123456789ABCDEF";
  if (*(int *)(*(long *)(*(long *)(this + 0x20) + 8) + 0x14) == 0x78) {
    pcVar10 = "0123456789abcdef";
  }
  pwVar8 = pwVar7 + uVar2;
  uVar11 = *(ulong *)(*(long *)(this + 0x20) + 0x10);
  do {
    pwVar8 = pwVar8 + -1;
    *pwVar8 = (int)pcVar10[(uint)uVar11 & 0xf];
    bVar3 = 0xf < uVar11;
    uVar11 = uVar11 >> 4;
  } while (bVar3);
  *it = pwVar7 + uVar2;
  return;
}

Assistant:

FMT_CONSTEXPR size_t size() const { return size_; }